

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_increase_flow_level(yaml_parser_t *parser)

{
  void *__dest;
  int iVar1;
  undefined1 local_40 [8];
  yaml_simple_key_t empty_simple_key;
  yaml_parser_t *parser_local;
  
  empty_simple_key.mark.column = (size_t)parser;
  memset(local_40,0,0x28);
  if ((*(long *)(empty_simple_key.mark.column + 0x168) ==
       *(long *)(empty_simple_key.mark.column + 0x160)) &&
     (iVar1 = yaml_stack_extend((void **)(empty_simple_key.mark.column + 0x158),
                                (void **)(empty_simple_key.mark.column + 0x168),
                                (void **)(empty_simple_key.mark.column + 0x160)), iVar1 == 0)) {
    *(undefined4 *)empty_simple_key.mark.column = 1;
    parser_local._4_4_ = 0;
  }
  else {
    __dest = *(void **)(empty_simple_key.mark.column + 0x168);
    *(long *)(empty_simple_key.mark.column + 0x168) = (long)__dest + 0x28;
    memcpy(__dest,local_40,0x28);
    if (*(int *)(empty_simple_key.mark.column + 0x100) == 0x7fffffff) {
      *(undefined4 *)empty_simple_key.mark.column = 1;
      parser_local._4_4_ = 0;
    }
    else {
      *(int *)(empty_simple_key.mark.column + 0x100) =
           *(int *)(empty_simple_key.mark.column + 0x100) + 1;
      parser_local._4_4_ = 1;
    }
  }
  return parser_local._4_4_;
}

Assistant:

static int
yaml_parser_increase_flow_level(yaml_parser_t *parser)
{
    yaml_simple_key_t empty_simple_key = { 0, 0, 0, { 0, 0, 0 } };

    /* Reset the simple key on the next level. */

    if (!PUSH(parser, parser->simple_keys, empty_simple_key))
        return 0;

    /* Increase the flow level. */

    if (parser->flow_level == INT_MAX) {
        parser->error = YAML_MEMORY_ERROR;
        return 0;
    }

    parser->flow_level++;

    return 1;
}